

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_gfx_blend_mode(rf_blend_mode mode)

{
  uint uVar1;
  uint uVar2;
  
  rf_gfx_draw();
  if (mode == RF_BLEND_MULTIPLIED) {
    uVar2 = 0x306;
LAB_00145362:
    uVar1 = 0x303;
  }
  else {
    if (mode != RF_BLEND_ADDITIVE) {
      if (mode != RF_BLEND_ALPHA) goto LAB_0014536d;
      uVar2 = 0x302;
      goto LAB_00145362;
    }
    uVar1 = 1;
    uVar2 = 0x302;
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.BlendFunc)(uVar2,uVar1);
LAB_0014536d:
  (rf__ctx->field_0).blend_mode = mode;
  return;
}

Assistant:

RF_API void rf_gfx_blend_mode(rf_blend_mode mode)
{
    rf_gfx_draw();

    switch (mode)
    {
        case RF_BLEND_ALPHA: rf_gl.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA); break;
        case RF_BLEND_ADDITIVE: rf_gl.BlendFunc(GL_SRC_ALPHA, GL_ONE); break; // Alternative: glBlendFunc(GL_ONE, GL_ONE);
        case RF_BLEND_MULTIPLIED: rf_gl.BlendFunc(GL_DST_COLOR, GL_ONE_MINUS_SRC_ALPHA); break;
        default: break;
    }

    rf_ctx.blend_mode = mode;
}